

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

bool __thiscall
miniros::MasterLink::getParamImpl<bool>
          (MasterLink *this,string *key,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *map,bool cached)

{
  bool bVar1;
  Type *pTVar2;
  pointer ppVar3;
  byte in_CL;
  XmlRpcValue *in_RDX;
  iterator it;
  RpcValue xml_value;
  undefined1 in_stack_00000427;
  RpcValue *in_stack_00000428;
  string *in_stack_00000430;
  MasterLink *in_stack_00000438;
  XmlRpcValue *in_stack_ffffffffffffff58;
  XmlRpcValue *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  byte in_stack_ffffffffffffff6f;
  key_type *in_stack_ffffffffffffff98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffffa0;
  _Self local_58;
  _Self local_50;
  undefined4 local_48;
  XmlRpcValue local_38;
  byte local_21;
  XmlRpcValue *local_20;
  byte local_1;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38);
  bVar1 = getParamImpl(in_stack_00000438,in_stack_00000430,in_stack_00000428,(bool)in_stack_00000427
                      );
  if (bVar1) {
    pTVar2 = XmlRpc::XmlRpcValue::getType(&local_38);
    if (*pTVar2 == TypeStruct) {
      local_50._M_node = (_Base_ptr)XmlRpc::XmlRpcValue::begin_abi_cxx11_(in_stack_ffffffffffffff58)
      ;
      while( true ) {
        local_58._M_node = (_Base_ptr)XmlRpc::XmlRpcValue::end_abi_cxx11_(in_stack_ffffffffffffff58)
        ;
        bVar1 = std::operator!=(&local_50,&local_58);
        if (!bVar1) break;
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
                               *)0x461d9c);
        pTVar2 = XmlRpc::XmlRpcValue::getType(&ppVar3->second);
        bVar1 = xml_castable<bool>(*pTVar2);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_00461e6f;
        }
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
                      *)0x461dd2);
        XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff6f =
             xml_cast<bool>((RpcValue *)
                            CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
        in_stack_ffffffffffffff58 = local_20;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
                      *)0x461e0b);
        in_stack_ffffffffffffff60 =
             (XmlRpcValue *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        *(byte *)&in_stack_ffffffffffffff60->_type = in_stack_ffffffffffffff6f & 1;
        XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x461e36);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>
                      *)in_stack_ffffffffffffff60);
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_00461e6f:
  local_48 = 1;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x461e79);
  return (bool)(local_1 & 1);
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::map<std::string, T>& map, bool cached)
{
  RpcValue xml_value;
  if (!getParamImpl(key, xml_value, cached)) {
    return false;
  }

  // Make sure it's a struct type
  if (xml_value.getType() != RpcValue::TypeStruct) {
    return false;
  }

  // Fill the map with stuff
  for (auto it = xml_value.begin(); it != xml_value.end(); ++it) {
    // Make sure this element is the right type
    if (!xml_castable<T>(it->second.getType())) {
      return false;
    }
    // Store the element
    map[it->first] = xml_cast<T>(it->second);
  }

  return true;
}